

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

Gia_Man_t *
Gia_ManCorrSpecReduceInit
          (Gia_Man_t *p,int nFrames,int nPrefix,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int *piVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  Gia_Obj_t *pGVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  Gia_Obj_t *pGVar18;
  long lVar19;
  int iVar20;
  uint local_5c;
  
  if (nFrames < 2 || fScorr != 0) {
    if ((nPrefix == 0) && (nFrames < 1 || fScorr == 0)) {
      __assert_fail("(!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0xe5,
                    "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                   );
    }
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0xe6,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0xe7,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar4 = nPrefix + nFrames;
  iVar12 = fScorr + iVar4;
  uVar16 = (long)iVar12 * (long)p->nObjs;
  iVar20 = (int)uVar16;
  if ((p->vCopies).nCap < iVar20) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(uVar16 * 4);
    }
    else {
      piVar5 = (int *)realloc(piVar5,uVar16 * 4);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar20;
  }
  if (0 < iVar20) {
    memset((p->vCopies).pArray,0xff,(uVar16 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar20;
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs * iVar4);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  iVar20 = p->nRegs;
  if (iVar20 < 1) {
LAB_005c714f:
    if (0 < iVar12) {
      iVar20 = 0;
      do {
        if (p->nObjs < 1) {
LAB_005c75e1:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar13 = p->nObjs * iVar20;
        if (((int)uVar13 < 0) || ((p->vCopies).nSize <= (int)uVar13)) {
LAB_005c761f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[uVar13] = 0;
        pVVar9 = p->vCis;
        uVar16 = (ulong)(uint)pVVar9->nSize;
        if (p->nRegs < pVVar9->nSize) {
          lVar17 = 0;
          do {
            if ((int)uVar16 <= lVar17) goto LAB_005c765d;
            iVar15 = pVVar9->pArray[lVar17];
            if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_005c7600;
            pGVar11 = p->pObjs;
            if (pGVar11 == (Gia_Obj_t *)0x0) break;
            pGVar8 = Gia_ManAppendObj(p_00);
            uVar16 = *(ulong *)pGVar8;
            *(ulong *)pGVar8 = uVar16 | 0x9fffffff;
            *(ulong *)pGVar8 =
                 uVar16 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar18 = p_00->pObjs;
            if ((pGVar8 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar8)) goto LAB_005c75e1;
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar18) >> 2) * -0x55555555);
            pGVar18 = p_00->pObjs;
            if ((pGVar8 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar8)) goto LAB_005c75e1;
            pGVar11 = pGVar11 + iVar15;
            pGVar3 = p->pObjs;
            if ((pGVar11 < pGVar3) || (pGVar3 + p->nObjs <= pGVar11)) goto LAB_005c75e1;
            uVar13 = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555 +
                     p->nObjs * iVar20;
            if (((int)uVar13 < 0) || ((p->vCopies).nSize <= (int)uVar13)) goto LAB_005c761f;
            (p->vCopies).pArray[uVar13] =
                 (int)((ulong)((long)pGVar8 - (long)pGVar18) >> 2) * 0x55555556;
            lVar17 = lVar17 + 1;
            pVVar9 = p->vCis;
            uVar16 = (ulong)pVVar9->nSize;
          } while (lVar17 < (long)(uVar16 - (long)p->nRegs));
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 != iVar12);
    }
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 1000;
    pVVar9->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar9->pArray = piVar5;
    *pvOutputs = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 1000;
    pVVar9->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar9->pArray = piVar5;
    iVar12 = nPrefix;
    if (0 < nFrames) {
      do {
        uVar16 = (ulong)(uint)p->nObjs;
        if (1 < p->nObjs) {
          lVar19 = 1;
          lVar17 = 0xc;
          do {
            pGVar11 = p->pObjs;
            uVar14 = (ulong)(uint)p->pReprs[lVar19] & 0xfffffff;
            if (uVar14 == 0xfffffff) {
              pGVar18 = (Gia_Obj_t *)0x0;
            }
            else {
              if ((int)uVar16 <= (int)uVar14) goto LAB_005c7600;
              pGVar18 = pGVar11 + uVar14;
            }
            if (pGVar18 != (Gia_Obj_t *)0x0) {
              if (((uint)p->pReprs[lVar19] & 0xfffffff) == 0) {
                local_5c = 0;
              }
              else {
                local_5c = Gia_ManCorrSpecReal(p_00,p,pGVar18,iVar12,nPrefix);
              }
              pGVar8 = (Gia_Obj_t *)(&pGVar11->field_0x0 + lVar17);
              uVar13 = Gia_ManCorrSpecReal(p_00,p,pGVar8,iVar12,nPrefix);
              if ((int)uVar13 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf5,"int Abc_LitNotCond(int, int)");
              }
              uVar13 = uVar13 ^ ((uint)((ulong)*(undefined8 *)pGVar18 >> 0x20) ^
                                (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20)) >> 0x1f;
              if (local_5c != uVar13) {
                pGVar3 = p->pObjs;
                if ((pGVar18 < pGVar3) || (pGVar3 + p->nObjs <= pGVar18)) goto LAB_005c75e1;
                Vec_IntPush(*pvOutputs,
                            (int)((ulong)((long)pGVar18 - (long)pGVar3) >> 2) * -0x55555555);
                pGVar18 = p->pObjs;
                if ((pGVar8 < pGVar18) || (pGVar18 + p->nObjs <= pGVar8)) goto LAB_005c75e1;
                Vec_IntPush(*pvOutputs,
                            (int)((ulong)((long)pGVar11 + (lVar17 - (long)pGVar18)) >> 2) *
                            -0x55555555);
                iVar20 = Gia_ManHashXor(p_00,local_5c,uVar13);
                Vec_IntPush(pVVar9,iVar20);
              }
            }
            lVar19 = lVar19 + 1;
            uVar16 = (ulong)p->nObjs;
            lVar17 = lVar17 + 0xc;
          } while (lVar19 < (long)uVar16);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar4);
    }
    iVar4 = pVVar9->nSize;
    if (0 < (long)iVar4) {
      piVar5 = pVVar9->pArray;
      lVar17 = 0;
      do {
        Gia_ManAppendCo(p_00,piVar5[lVar17]);
        lVar17 = lVar17 + 1;
      } while (iVar4 != lVar17);
    }
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (int *)0x0;
    }
    free(pVVar9);
    Gia_ManHashStop(p_00);
    piVar5 = (p->vCopies).pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      (p->vCopies).pArray = (int *)0x0;
    }
    (p->vCopies).nCap = 0;
    (p->vCopies).nSize = 0;
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar10;
  }
  iVar15 = 0;
  do {
    iVar1 = p->vCis->nSize;
    uVar13 = (iVar1 - iVar20) + iVar15;
    if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
LAB_005c765d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar20 = p->vCis->pArray[uVar13];
    if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) {
LAB_005c7600:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar11 = p->pObjs;
    if (pGVar11 == (Gia_Obj_t *)0x0) goto LAB_005c714f;
    pGVar8 = Gia_ManAppendObj(p_00);
    uVar16 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar16 | 0x9fffffff;
    *(ulong *)pGVar8 =
         uVar16 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar18 = p_00->pObjs;
    if ((pGVar8 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar8)) goto LAB_005c75e1;
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar18) >> 2) * -0x55555555);
    if ((pGVar8 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar8)) goto LAB_005c75e1;
    pGVar11 = pGVar11 + iVar20;
    pGVar18 = p->pObjs;
    if ((pGVar11 < pGVar18) || (pGVar18 + p->nObjs <= pGVar11)) goto LAB_005c75e1;
    uVar13 = (int)((long)pGVar11 - (long)pGVar18 >> 2) * -0x55555555;
    if (((int)uVar13 < 0) || ((p->vCopies).nSize <= (int)uVar13)) goto LAB_005c761f;
    (p->vCopies).pArray[uVar13 & 0x7fffffff] = 0;
    iVar15 = iVar15 + 1;
    iVar20 = p->nRegs;
    if (iVar20 <= iVar15) goto LAB_005c714f;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduceInit( Gia_Man_t * p, int nFrames, int nPrefix, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrevNew, iObjNew;
    assert( (!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+nPrefix+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( (nFrames+nPrefix) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_ManAppendCi(pNew);
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    }
    for ( f = 0; f < nFrames+nPrefix+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    for ( f = nPrefix; f < nFrames+nPrefix; f++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, f, nPrefix );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}